

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputePipeline.cpp
# Opt level: O0

Ptr<ComputePipeline>
myvk::ComputePipeline::Create
          (Ptr<PipelineLayout> *pipeline_layout,Ptr<ShaderModule> *shader_module,
          VkSpecializationInfo *p_specialization_info)

{
  VkResult VVar1;
  element_type *peVar2;
  element_type *peVar3;
  VkDevice pVVar4;
  VkPipelineCache this;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<ComputePipeline> PVar6;
  VkComputePipelineCreateInfo create_info;
  shared_ptr<myvk::ComputePipeline> ret;
  uint in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  shared_ptr<myvk::PipelineLayout> *in_stack_fffffffffffffed0;
  VkSpecializationInfo *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  VkShaderStageFlagBits stage;
  PFN_vkCreateComputePipelines p_Var7;
  ShaderModule *in_stack_fffffffffffffef0;
  VkComputePipelineCreateInfo local_98;
  
  stage = (VkShaderStageFlagBits)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  std::make_shared<myvk::ComputePipeline>();
  std::__shared_ptr_access<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x2e148d);
  std::shared_ptr<myvk::PipelineLayout>::operator=
            (in_stack_fffffffffffffed0,
             (shared_ptr<myvk::PipelineLayout> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_98.basePipelineHandle = (VkPipeline)0x0;
  local_98.basePipelineIndex = 0;
  local_98._92_4_ = 0;
  local_98.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_98.layout = (VkPipelineLayout)0x0;
  local_98.stage.module = (VkShaderModule)0x0;
  local_98.stage.pName = (char *)0x0;
  local_98.stage.pNext = (void *)0x0;
  local_98.stage.flags = 0;
  local_98.stage.stage = 0;
  local_98.flags = 0;
  local_98._20_4_ = 0;
  local_98.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_98.stage._4_4_ = 0;
  local_98.pNext = (void *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_98._4_4_ = 0;
  peVar2 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e14e9);
  local_98.layout = PipelineLayout::GetHandle(peVar2);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e1512);
  ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_fffffffffffffef0,stage,in_stack_fffffffffffffee0);
  p_Var7 = vkCreateComputePipelines;
  peVar2 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e1574);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar3 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2e1591);
  pVVar4 = Device::GetHandle(peVar3);
  peVar2 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e15ad);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar3 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2e15ca);
  this = Device::GetPipelineCacheHandle(peVar3);
  peVar5 = std::__shared_ptr_access<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e15e6);
  VVar1 = (*p_Var7)(pVVar4,this,1,&local_98,(VkAllocationCallbacks *)0x0,
                    &(peVar5->super_PipelineBase).m_pipeline);
  if (VVar1 == VK_SUCCESS) {
    std::shared_ptr<myvk::ComputePipeline>::shared_ptr
              ((shared_ptr<myvk::ComputePipeline> *)this,
               (shared_ptr<myvk::ComputePipeline> *)(ulong)in_stack_fffffffffffffec8);
  }
  else {
    std::shared_ptr<myvk::ComputePipeline>::shared_ptr
              ((shared_ptr<myvk::ComputePipeline> *)this,
               (nullptr_t)CONCAT44(VVar1,in_stack_fffffffffffffec8));
  }
  std::shared_ptr<myvk::ComputePipeline>::~shared_ptr((shared_ptr<myvk::ComputePipeline> *)0x2e1681)
  ;
  PVar6.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<ComputePipeline>)
         PVar6.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ComputePipeline> ComputePipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                             const Ptr<ShaderModule> &shader_module,
                                             VkSpecializationInfo *p_specialization_info) {
	std::shared_ptr<ComputePipeline> ret = std::make_shared<ComputePipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;

	VkComputePipelineCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
	create_info.layout = pipeline_layout->GetHandle();
	create_info.stage =
	    shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_COMPUTE_BIT, p_specialization_info);

	if (vkCreateComputePipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                             pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &create_info, nullptr,
	                             &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}